

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O3

void __thiscall
ThreadContext::ThreadContext
          (ThreadContext *this,AllocationPolicyManager *allocationPolicyManager,
          ThreadServiceCallback threadServiceCallback,bool enableExperimentalFeatures)

{
  IdleDecommitPageAllocator *this_00;
  ArenaAllocator *this_01;
  ArenaAllocator *this_02;
  code *pcVar1;
  BackgroundPageQueue *pBVar2;
  bool bVar3;
  DWORD DVar4;
  uint uVar5;
  BOOL BVar6;
  HANDLE pVVar7;
  Stack<HostScriptContext_*,_Memory::ArenaAllocator,_false,_DefaultComparer> *pSVar8;
  undefined4 *puVar9;
  Var *__s;
  DynamicProfileMutator *pDVar10;
  ThreadContext *this_03;
  ulong uVar11;
  size_t requestedBytes;
  
  (this->super_DefaultRecyclerCollectionWrapper).super_RecyclerCollectionWrapper.
  _isScriptContextCloseGCPending = 0;
  (this->super_DefaultRecyclerCollectionWrapper).super_RecyclerCollectionWrapper.
  _vptr_RecyclerCollectionWrapper = (_func_int **)&PTR_PreCollectionCallBack_014d9858;
  (this->super_DoublyLinkedListElement<ThreadContext,_Memory::ArenaAllocator>).previous = (Type)0x0;
  (this->super_DoublyLinkedListElement<ThreadContext,_Memory::ArenaAllocator>).next = (Type)0x0;
  ThreadContextInfo::ThreadContextInfo(&this->super_ThreadContextInfo);
  (this->super_DefaultRecyclerCollectionWrapper).super_RecyclerCollectionWrapper.
  _vptr_RecyclerCollectionWrapper = (_func_int **)&PTR_PreCollectionCallBack_014dc590;
  (this->super_ThreadContextInfo)._vptr_ThreadContextInfo =
       (_func_int **)&PTR_GetProcessHandle_014dc690;
  this->emptyStringPropertyRecord = (PropertyRecord *)0x0;
  this->noScriptScope = false;
  this->m_jitNumericProperties = (BVSparse<Memory::HeapAllocator> *)0x0;
  this->m_jitNeedsPropertyUpdate = false;
  this->threadContextFlags = ThreadContextFlagNoFlag;
  this->debugManager = (DebugManager *)0x0;
  this->heapEnum = (IActiveScriptProfilerHeapEnum *)0x0;
  this->propertyMap = (PropertyMap *)0x0;
  this->m_remoteThreadContextInfo = (PTHREADCONTEXT_HANDLE)0x0;
  this->m_prereservedRegionAddr = 0;
  DVar4 = GetCurrentThreadId();
  this->currentThreadId = DVar4;
  this->stackLimitForCurrentThread = 0;
  this->stackProber = (StackProber *)0x0;
  this->isThreadBound = false;
  this->hasThrownPendingException = false;
  this->hasBailedOutBitPtr = (bool *)0x0;
  *(undefined4 *)((long)&this->hasBailedOutBitPtr + 7) = 0;
  this->allocationPolicyManager = allocationPolicyManager;
  (this->threadService).threadService = threadServiceCallback;
  (this->threadService).isInCallback = false;
  Memory::PreReservedVirtualAllocWrapper::PreReservedVirtualAllocWrapper
            (&this->preReservedVirtualAllocator);
  this->callRootLevel = 0;
  (this->backgroundPageQueue).bgFreePageList = (FreePageEntry *)0x0;
  pBVar2 = &this->backgroundPageQueue;
  (pBVar2->backgroundPageQueueCriticalSection).super_CCLock.mutexPtr[0] = '\0';
  (pBVar2->backgroundPageQueueCriticalSection).super_CCLock.mutexPtr[1] = '\0';
  (pBVar2->backgroundPageQueueCriticalSection).super_CCLock.mutexPtr[2] = '\0';
  (pBVar2->backgroundPageQueueCriticalSection).super_CCLock.mutexPtr[3] = '\0';
  (pBVar2->backgroundPageQueueCriticalSection).super_CCLock.mutexPtr[4] = '\0';
  (pBVar2->backgroundPageQueueCriticalSection).super_CCLock.mutexPtr[5] = '\0';
  (pBVar2->backgroundPageQueueCriticalSection).super_CCLock.mutexPtr[6] = '\0';
  (pBVar2->backgroundPageQueueCriticalSection).super_CCLock.mutexPtr[7] = '\0';
  CCLock::Reset(&(this->backgroundPageQueue).backgroundPageQueueCriticalSection.super_CCLock,true);
  (this->backgroundPageQueue).isZeroPageQueue = false;
  this_00 = &this->pageAllocator;
  Memory::IdleDecommitPageAllocator::IdleDecommitPageAllocator
            (this_00,allocationPolicyManager,PageAllocatorType_Thread,
             (ConfigFlagsTable *)&Js::Configuration::Global,0,
             Memory::RecyclerHeuristic::Instance.DefaultMaxFreePageCount,false,
             &this->backgroundPageQueue,0x20,false);
  this->recycler = (Recycler *)0x0;
  (this->delayFreeCallback).listOfBuffers.
  super_SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>.
  super_SListNodeBase<Memory::HeapAllocator>.next = (Type)&this->delayFreeCallback;
  (this->delayFreeCallback).listOfBuffers.
  super_SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>.
  super_RealCount.count = 0;
  (this->delayFreeCallback).listOfBuffers.allocator = &Memory::HeapAllocator::Instance;
  this_01 = &this->threadAlloc;
  this->caseInvariantPropertySet = (PropertyNoCaseSetType *)0x0;
  this->rootPendingClose = (ScriptContext *)0x0;
  this->entryExitRecord = (ScriptEntryExitRecord *)0x0;
  this->leafInterpreterFrame = (InterpreterStackFrame *)0x0;
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            (&this_01->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
             L"TC",&this_00->super_PageAllocator,Js::Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  this->threadServiceWrapper = (ThreadServiceWrapper *)0x0;
  this->tryHandlerAddrOfReturnAddr = (void *)0x0;
  this->redeferralState = InitialRedeferralState;
  this->gcSinceLastRedeferral = 0;
  this->gcSinceCallCountsCollected = 0;
  this->nextTypeId = 0x800;
  this->polymorphicCacheState = 0;
  this->jobProcessor = (JobProcessor *)0x0;
  pVVar7 = GetCurrentProcess();
  Memory::CustomHeap::
  CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
  CodePageAllocators(&this->thunkPageAllocators,allocationPolicyManager,false,
                     (PreReservedVirtualAllocWrapper *)0x0,pVVar7);
  pVVar7 = GetCurrentProcess();
  Memory::CustomHeap::
  CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
  CodePageAllocators(&this->codePageAllocators,allocationPolicyManager,true,
                     &this->preReservedVirtualAllocator,pVVar7);
  this->topLevelScriptSite = (ScriptSite *)0x0;
  this->scriptContextList = (ScriptContext *)0x0;
  (this->recyclableData).ptr = (RecyclableData *)0x0;
  this->temporaryArenaAllocatorCount = 0;
  this->temporaryGuestArenaAllocatorCount = 0;
  this->scriptContextEverRegistered = false;
  this->nativeCodeSize = 0;
  this->sourceCodeSize = 0;
  (this->hTimer).data.cacheSysTime = 0.0;
  (this->hTimer).data.cacheTick = 0xffffffffffffffff;
  (this->hTimer).data.previousDifference = 0;
  this->stackProbeCount = 0;
  this->exceptionCode = 0;
  this_02 = &this->inlineCacheThreadInfoAllocator;
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            (&this_02->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
             L"TC-InlineCacheInfo",&this_00->super_PageAllocator,Js::Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            (&(this->isInstInlineCacheThreadInfoAllocator).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
             L"TC-IsInstInlineCacheInfo",&this_00->super_PageAllocator,Js::Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            (&(this->equivalentTypeCacheInfoAllocator).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
             L"TC-EquivalentTypeCacheInfo",&this_00->super_PageAllocator,Js::Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  (this->equivalentTypeCacheEntryPoints).super_DListNodeBase<Js::EntryPointInfo_*>.next.base =
       &(this->equivalentTypeCacheEntryPoints).super_DListNodeBase<Js::EntryPointInfo_*>;
  (this->equivalentTypeCacheEntryPoints).super_DListNodeBase<Js::EntryPointInfo_*>.prev.base =
       &(this->equivalentTypeCacheEntryPoints).super_DListNodeBase<Js::EntryPointInfo_*>;
  (this->equivalentTypeCacheEntryPoints).super_RealCount.count = 0;
  (this->protoInlineCacheByPropId).buckets = (Type)0x0;
  (this->protoInlineCacheByPropId).entries = (Type)0x0;
  (this->protoInlineCacheByPropId).alloc = this_02;
  (this->protoInlineCacheByPropId).size = 0;
  (this->protoInlineCacheByPropId).bucketCount = 0;
  (this->protoInlineCacheByPropId).count = 0;
  (this->protoInlineCacheByPropId).freeCount = 0;
  (this->protoInlineCacheByPropId).modFunctionIndex = 0x4b;
  (this->protoInlineCacheByPropId).stats = (Type)0x0;
  JsUtil::
  BaseDictionary<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Initialize(&this->protoInlineCacheByPropId,0x209);
  (this->storeFieldInlineCacheByPropId).buckets = (Type)0x0;
  (this->storeFieldInlineCacheByPropId).entries = (Type)0x0;
  (this->storeFieldInlineCacheByPropId).alloc = this_02;
  (this->storeFieldInlineCacheByPropId).size = 0;
  (this->storeFieldInlineCacheByPropId).bucketCount = 0;
  (this->storeFieldInlineCacheByPropId).count = 0;
  (this->storeFieldInlineCacheByPropId).freeCount = 0;
  (this->storeFieldInlineCacheByPropId).modFunctionIndex = 0x4b;
  (this->storeFieldInlineCacheByPropId).stats = (Type)0x0;
  JsUtil::
  BaseDictionary<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Initialize(&this->storeFieldInlineCacheByPropId,0x125);
  this->registeredInlineCacheCount = 0;
  this->unregisteredInlineCacheCount = 0;
  (this->isInstInlineCacheByFunction).buckets = (Type)0x0;
  (this->isInstInlineCacheByFunction).entries = (Type)0x0;
  (this->isInstInlineCacheByFunction).alloc = &this->isInstInlineCacheThreadInfoAllocator;
  (this->isInstInlineCacheByFunction).size = 0;
  (this->isInstInlineCacheByFunction).bucketCount = 0;
  (this->isInstInlineCacheByFunction).count = 0;
  (this->isInstInlineCacheByFunction).freeCount = 0;
  (this->isInstInlineCacheByFunction).modFunctionIndex = 0x4b;
  (this->isInstInlineCacheByFunction).stats = (Type)0x0;
  JsUtil::
  BaseDictionary<void_*,_Js::IsInstInlineCache_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Initialize(&this->isInstInlineCacheByFunction,0x83);
  (this->isConcatSpreadableCache).type0 = (Type *)0x0;
  (this->isConcatSpreadableCache).type1 = (Type *)0x0;
  (this->isConcatSpreadableCache).lastAccess = 1;
  (this->isConcatSpreadableCache).result0 = 0;
  (this->isConcatSpreadableCache).result1 = 0;
  Js::ThreadCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::ThreadCacheRegistry
            (&this->noSpecialPropertyRegistry,&this_00->super_PageAllocator);
  Js::ThreadCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
  ThreadCacheRegistry(&this->onlyWritablePropertyRegistry,&this_00->super_PageAllocator);
  (this->collectCallBackList).super_DListNodeBase<ThreadContext::CollectCallBack>.next.base =
       &(this->collectCallBackList).super_DListNodeBase<ThreadContext::CollectCallBack>;
  (this->collectCallBackList).super_DListNodeBase<ThreadContext::CollectCallBack>.prev.base =
       &(this->collectCallBackList).super_DListNodeBase<ThreadContext::CollectCallBack>;
  (this->collectCallBackList).super_RealCount.count = 0;
  (this->csCollectionCallBack).super_CCLock.mutexPtr[0] = '\0';
  (this->csCollectionCallBack).super_CCLock.mutexPtr[1] = '\0';
  (this->csCollectionCallBack).super_CCLock.mutexPtr[2] = '\0';
  (this->csCollectionCallBack).super_CCLock.mutexPtr[3] = '\0';
  (this->csCollectionCallBack).super_CCLock.mutexPtr[4] = '\0';
  (this->csCollectionCallBack).super_CCLock.mutexPtr[5] = '\0';
  (this->csCollectionCallBack).super_CCLock.mutexPtr[6] = '\0';
  (this->csCollectionCallBack).super_CCLock.mutexPtr[7] = '\0';
  CCLock::Reset(&(this->csCollectionCallBack).super_CCLock,true);
  this->hasCollectionCallBack = false;
  this->isOptimizedForManyInstances = (bool)DAT_015bc484;
  this->bgJit = (bool)DAT_01593391;
  this->isProfilingUserCode = true;
  (this->csFunctionBody).super_CCLock.mutexPtr[0] = '\0';
  (this->csFunctionBody).super_CCLock.mutexPtr[1] = '\0';
  (this->csFunctionBody).super_CCLock.mutexPtr[2] = '\0';
  (this->csFunctionBody).super_CCLock.mutexPtr[3] = '\0';
  (this->csFunctionBody).super_CCLock.mutexPtr[4] = '\0';
  (this->csFunctionBody).super_CCLock.mutexPtr[5] = '\0';
  (this->csFunctionBody).super_CCLock.mutexPtr[6] = '\0';
  (this->csFunctionBody).super_CCLock.mutexPtr[7] = '\0';
  this->jsrtRuntime = (void *)0x0;
  this->hasUnhandledException = false;
  this->hasCatchHandler = false;
  this->disableImplicitFlags = DisableImplicitNoFlag;
  this->hasCatchHandlerToUserCode = false;
  this->crefSContextForDiag = 0;
  (this->entropy).previousValue = 0;
  (this->entropy).u = (anon_union_4_2_f5ec4e19_for_u)0x0;
  (this->entropy).currentIndex = 0;
  this->standardUTF8Chars = (StandardChars<unsigned_char> *)0x0;
  this->standardUnicodeChars = (StandardChars<char16_t> *)0x0;
  CCLock::Reset(&(this->csFunctionBody).super_CCLock,true);
  Js::Amd64ContextsManager::Amd64ContextsManager(&this->amd64ContextsManager);
  (this->dynamicObjectEnumeratorCacheMap).buckets = (Type)0x0;
  (this->dynamicObjectEnumeratorCacheMap).entries = (Type)0x0;
  (this->dynamicObjectEnumeratorCacheMap).alloc = &Memory::HeapAllocator::Instance;
  (this->dynamicObjectEnumeratorCacheMap).size = 0;
  (this->dynamicObjectEnumeratorCacheMap).bucketCount = 0;
  (this->dynamicObjectEnumeratorCacheMap).count = 0;
  (this->dynamicObjectEnumeratorCacheMap).freeCount = 0;
  (this->dynamicObjectEnumeratorCacheMap).modFunctionIndex = 0x4b;
  (this->dynamicObjectEnumeratorCacheMap).stats = (Type)0x0;
  JsUtil::
  BaseDictionary<const_Js::DynamicType_*,_void_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Initialize(&this->dynamicObjectEnumeratorCacheMap,0x10);
  (this->nativeLibraryEntry).head = (Entry *)0x0;
  DelayLoadLibrary::DelayLoadLibrary(&(this->ucrtC99MathApis).super_DelayLoadLibrary);
  (this->ucrtC99MathApis).super_DelayLoadLibrary._vptr_DelayLoadLibrary =
       (_func_int **)&PTR__DelayLoadLibrary_014dcdb0;
  (this->ucrtC99MathApis).m_pfnlog2 = (PFNMathFn)0x0;
  (this->ucrtC99MathApis).m_pfnlog1p = (PFNMathFn)0x0;
  (this->ucrtC99MathApis).m_pfnexpm1 = (PFNMathFn)0x0;
  (this->ucrtC99MathApis).m_pfnacosh = (PFNMathFn)0x0;
  (this->ucrtC99MathApis).m_pfnasinh = (PFNMathFn)0x0;
  (this->ucrtC99MathApis).m_pfnatanh = (PFNMathFn)0x0;
  (this->ucrtC99MathApis).m_pfntrunc = (PFNMathFn)0x0;
  (this->ucrtC99MathApis).m_pfncbrt = (PFNMathFn)0x0;
  this->loopDepth = '\0';
  ThreadConfiguration::ThreadConfiguration(&this->configuration,enableExperimentalFeatures);
  this->closedScriptContextCount = 0;
  this->visibilityState = Undefined;
  this->tridentLoadAddress = (void *)0x0;
  this->handlerPropertyId = -1;
  this->TTDContext = (ThreadContextTTD *)0x0;
  this->TTDExecutionInfo = (ExecutionInfoManager *)0x0;
  *(undefined8 *)((long)&this->TTDExecutionInfo + 4) = 0;
  *(undefined8 *)((long)&this->TTDLog + 4) = 0;
  this->expirableObjectList = (ExpirableObjectList *)0x0;
  this->expirableObjectDisposeList = (ExpirableObjectList *)0x0;
  this->numExpirableObjects = 0;
  this->expirableCollectModeGcCount = -1;
  this->disableExpiration = false;
  this->callDispose = true;
  this->bailOutByteCodeLocationCount = 0;
  this->interruptPoller = (InterruptPoller *)0x0;
  (this->entryPointToBuiltInOperationIdCache).buckets = (Type)0x0;
  (this->entryPointToBuiltInOperationIdCache).entries = (Type)0x0;
  (this->entryPointToBuiltInOperationIdCache).alloc = this_01;
  (this->entryPointToBuiltInOperationIdCache).size = 0;
  (this->entryPointToBuiltInOperationIdCache).bucketCount = 0;
  (this->entryPointToBuiltInOperationIdCache).count = 0;
  (this->entryPointToBuiltInOperationIdCache).freeCount = 0;
  (this->entryPointToBuiltInOperationIdCache).modFunctionIndex = 0x4b;
  (this->entryPointToBuiltInOperationIdCache).stats = (Type)0x0;
  (this->recyclerTelemetryHostInterface).super_RecyclerTelemetryHostInterface.
  _vptr_RecyclerTelemetryHostInterface = (_func_int **)&PTR_GetLastScriptExecutionEndTime_014dc6f8;
  (this->recyclerTelemetryHostInterface).tc = this;
  pSVar8 = (Stack<HostScriptContext_*,_Memory::ArenaAllocator,_false,_DefaultComparer> *)
           new<Memory::ArenaAllocator>(0x30,this_01,0x364470);
  (pSVar8->list).super_ReadOnlyList<HostScriptContext_*,_Memory::ArenaAllocator,_DefaultComparer>.
  alloc = this_01;
  (pSVar8->list).super_ReadOnlyList<HostScriptContext_*,_Memory::ArenaAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014dced0;
  (pSVar8->list).super_ReadOnlyList<HostScriptContext_*,_Memory::ArenaAllocator,_DefaultComparer>.
  buffer = (Type)0x0;
  (pSVar8->list).super_ReadOnlyList<HostScriptContext_*,_Memory::ArenaAllocator,_DefaultComparer>.
  count = 0;
  (pSVar8->list).length = 0;
  (pSVar8->list).increment = 4;
  this->hostScriptContextStack = pSVar8;
  this->functionCount = 0;
  this->sourceInfoCount = 0;
  this->scriptContextCount = 0;
  this->isScriptActive = false;
  GetBailOutRegisterSaveSlotCount();
  uVar5 = GetBailOutRegisterSaveSlotCount();
  if (uVar5 == 0) {
    __s = (Var *)&DAT_00000008;
  }
  else {
    BVar6 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar6 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_007ac3c9;
      *puVar9 = 0;
    }
    uVar11 = (ulong)uVar5;
    requestedBytes = uVar11 * 8;
    __s = (Var *)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 AllocInternal(&this_01->
                                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                               ,requestedBytes);
    memset(__s,0,requestedBytes);
    memset(__s + uVar11,0,(requestedBytes + 0xf & 0xfffffffffffffff0) + uVar11 * -8);
    if (__s == (Var *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) {
LAB_007ac3c9:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar9 = 0;
      __s = (Var *)0x0;
    }
  }
  this->bailOutRegisterSaveSpace = __s;
  this->scriptSiteCount = 0;
  (this->pageAllocator).super_PageAllocator.debugName = L"Thread";
  pDVar10 = DynamicProfileMutator::GetMutator();
  this->dynamicProfileMutator = pDVar10;
  this->rootTrackerScriptContext = (ScriptContext *)0x0;
  DVar4 = GetCurrentThreadId();
  this->threadId = DVar4;
  CCLock::Enter(&s_csThreadContext.super_CCLock);
  JsUtil::DoublyLinkedListElement<ThreadContext,_Memory::ArenaAllocator>::
  LinkToBeginning<ThreadContext>(this,&globalListFirst,&globalListLast);
  (this->pageAllocator).super_PageAllocator.threadContextHandle = this;
  this_03 = (ThreadContext *)(ulong)DAT_015bc488;
  if (DAT_015bc488 == 0) {
    this_03 = (ThreadContext *)time((time_t *)0x0);
  }
  this->arrayMutationSeed = (uint)this_03;
  srand((uint)this_03);
  InitAvailableCommit(this_03);
  CCLock::Leave(&s_csThreadContext.super_CCLock);
  return;
}

Assistant:

ThreadContext::ThreadContext(AllocationPolicyManager * allocationPolicyManager, JsUtil::ThreadService::ThreadServiceCallback threadServiceCallback, bool enableExperimentalFeatures) :
    currentThreadId(::GetCurrentThreadId()),
    stackLimitForCurrentThread(0),
    stackProber(nullptr),
    isThreadBound(false),
    hasThrownPendingException(false),
    hasBailedOutBitPtr(nullptr),
    noScriptScope(false),
    heapEnum(nullptr),
    threadContextFlags(ThreadContextFlagNoFlag),
    JsUtil::DoublyLinkedListElement<ThreadContext>(),
    allocationPolicyManager(allocationPolicyManager),
    threadService(threadServiceCallback),
    isOptimizedForManyInstances(Js::Configuration::Global.flags.OptimizeForManyInstances),
    bgJit(Js::Configuration::Global.flags.BgJit),
    pageAllocator(allocationPolicyManager, PageAllocatorType_Thread, Js::Configuration::Global.flags, 0, RecyclerHeuristic::Instance.DefaultMaxFreePageCount,
        false
#if ENABLE_BACKGROUND_PAGE_FREEING
        , &backgroundPageQueue
#endif
        ),
    recycler(nullptr),
    hasCollectionCallBack(false),
    callDispose(true),
#if ENABLE_NATIVE_CODEGEN
    jobProcessor(nullptr),
#endif
    interruptPoller(nullptr),
    expirableCollectModeGcCount(-1),
    expirableObjectList(nullptr),
    expirableObjectDisposeList(nullptr),
    numExpirableObjects(0),
    disableExpiration(false),
    callRootLevel(0),
    nextTypeId((Js::TypeId)Js::Constants::ReservedTypeIds),
    entryExitRecord(nullptr),
    leafInterpreterFrame(nullptr),
    threadServiceWrapper(nullptr),
    tryHandlerAddrOfReturnAddr(nullptr),
    temporaryArenaAllocatorCount(0),
    temporaryGuestArenaAllocatorCount(0),
    crefSContextForDiag(0),
    m_prereservedRegionAddr(0),
    scriptContextList(nullptr),
    scriptContextEverRegistered(false),
#if DBG_DUMP || defined(PROFILE_EXEC)
    topLevelScriptSite(nullptr),
#endif
    polymorphicCacheState(0),
    stackProbeCount(0),
#ifdef BAILOUT_INJECTION
    bailOutByteCodeLocationCount(0),
#endif
    sourceCodeSize(0),
    nativeCodeSize(0),
    threadAlloc(_u("TC"), GetPageAllocator(), Js::Throw::OutOfMemory),
    inlineCacheThreadInfoAllocator(_u("TC-InlineCacheInfo"), GetPageAllocator(), Js::Throw::OutOfMemory),
    isInstInlineCacheThreadInfoAllocator(_u("TC-IsInstInlineCacheInfo"), GetPageAllocator(), Js::Throw::OutOfMemory),
    equivalentTypeCacheInfoAllocator(_u("TC-EquivalentTypeCacheInfo"), GetPageAllocator(), Js::Throw::OutOfMemory),
    protoInlineCacheByPropId(&inlineCacheThreadInfoAllocator, 521),
    storeFieldInlineCacheByPropId(&inlineCacheThreadInfoAllocator, 293),
    isInstInlineCacheByFunction(&isInstInlineCacheThreadInfoAllocator, 131),
    registeredInlineCacheCount(0),
    unregisteredInlineCacheCount(0),
    noSpecialPropertyRegistry(this->GetPageAllocator()),
    onlyWritablePropertyRegistry(this->GetPageAllocator()),
    standardUTF8Chars(0),
    standardUnicodeChars(0),
    hasUnhandledException(FALSE),
    hasCatchHandler(FALSE),
    disableImplicitFlags(DisableImplicitNoFlag),
    hasCatchHandlerToUserCode(false),
    caseInvariantPropertySet(nullptr),
    entryPointToBuiltInOperationIdCache(&threadAlloc, 0),
#if ENABLE_NATIVE_CODEGEN
    preReservedVirtualAllocator(),
#if !FLOATVAR
    codeGenNumberThreadAllocator(nullptr),
    xProcNumberPageSegmentManager(nullptr),
#endif
    m_jitNumericProperties(nullptr),
    m_jitNeedsPropertyUpdate(false),
#if DYNAMIC_INTERPRETER_THUNK || defined(ASMJS_PLAT)
    thunkPageAllocators(allocationPolicyManager, /* allocXData */ false, /* virtualAllocator */ nullptr, GetCurrentProcess()),
#endif
    codePageAllocators(allocationPolicyManager, ALLOC_XDATA, GetPreReservedVirtualAllocator(), GetCurrentProcess()),
#if defined(_CONTROL_FLOW_GUARD) && !defined(_M_ARM)
    jitThunkEmitter(this, &VirtualAllocWrapper::Instance , GetCurrentProcess()),
#endif
#endif
    dynamicObjectEnumeratorCacheMap(&HeapAllocator::Instance, 16),
    //threadContextFlags(ThreadContextFlagNoFlag),
#ifdef NTBUILD
    telemetryBlock(&localTelemetryBlock),
#endif
    configuration(enableExperimentalFeatures),
    jsrtRuntime(nullptr),
    propertyMap(nullptr),
    rootPendingClose(nullptr),
    exceptionCode(0),
    isProfilingUserCode(true),
    loopDepth(0),
    redeferralState(InitialRedeferralState),
    gcSinceLastRedeferral(0),
    gcSinceCallCountsCollected(0),
    tridentLoadAddress(nullptr),
    m_remoteThreadContextInfo(nullptr)
#ifdef ENABLE_SCRIPT_DEBUGGING
    , debugManager(nullptr)
#endif
#if ENABLE_TTD
    , TTDContext(nullptr)
    , TTDExecutionInfo(nullptr)
    , TTDLog(nullptr)
    , TTDRootNestingCount(0)
#endif
#ifdef ENABLE_DIRECTCALL_TELEMETRY
    , directCallTelemetry(this)
#endif
#if ENABLE_JS_REENTRANCY_CHECK
    , noJsReentrancy(false)
#endif
    , emptyStringPropertyRecord(nullptr)
    , recyclerTelemetryHostInterface(this)
    , reentrancySafeOrHandled(false)
    , isInReentrancySafeRegion(false)
    , closedScriptContextCount(0)
    , visibilityState(VisibilityState::Undefined)
{
    hostScriptContextStack = Anew(GetThreadAlloc(), JsUtil::Stack<HostScriptContext*>, GetThreadAlloc());

    functionCount = 0;
    sourceInfoCount = 0;
#if DBG || defined(RUNTIME_DATA_COLLECTION)
    scriptContextCount = 0;
#endif
    isScriptActive = false;

#ifdef ENABLE_CUSTOM_ENTROPY
    entropy.Initialize();
#endif

#if ENABLE_NATIVE_CODEGEN
    this->bailOutRegisterSaveSpace = AnewArrayZ(this->GetThreadAlloc(), Js::Var, GetBailOutRegisterSaveSlotCount());
#endif

#if DBG_DUMP
    scriptSiteCount = 0;
    pageAllocator.debugName = _u("Thread");
#endif
#ifdef DYNAMIC_PROFILE_MUTATOR
    this->dynamicProfileMutator = DynamicProfileMutator::GetMutator();
#endif

    PERF_COUNTER_INC(Basic, ThreadContext);

#ifdef LEAK_REPORT
    this->rootTrackerScriptContext = nullptr;
    this->threadId = ::GetCurrentThreadId();
#endif

#ifdef NTBUILD
    memset(&localTelemetryBlock, 0, sizeof(localTelemetryBlock));
#endif

    AutoCriticalSection autocs(ThreadContext::GetCriticalSection());
    ThreadContext::LinkToBeginning(this, &ThreadContext::globalListFirst, &ThreadContext::globalListLast);
#if DBG
    // Since we created our page allocator while we were constructing this thread context
    // it will pick up the thread context id that is current on the thread. We need to update
    // that now.
    pageAllocator.UpdateThreadContextHandle((ThreadContextId)this);
#endif

#if DBG
    arrayMutationSeed = (Js::Configuration::Global.flags.ArrayMutationTestSeed != 0) ? (uint)Js::Configuration::Global.flags.ArrayMutationTestSeed : (uint)time(NULL);
    srand(arrayMutationSeed);
#endif

    this->InitAvailableCommit();
}